

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

ConstantDataArray * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::ConstantDataArray,LLVMBC::Type*,std::vector<LLVMBC::Value*,dxil_spv::ThreadLocalAllocator<LLVMBC::Value*>>>
          (LLVMContext *this,Type **u,
          vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *u_1)

{
  Type *type;
  vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> local_48;
  ConstantDataArray *local_30;
  ConstantDataArray *t;
  ConstantDataArray *mem;
  vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *u_local_1;
  Type **u_local;
  LLVMContext *this_local;
  
  mem = (ConstantDataArray *)u_1;
  u_local_1 = (vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *)u;
  u_local = (Type **)this;
  local_30 = (ConstantDataArray *)allocate(this,0x50,8);
  t = local_30;
  if (local_30 == (ConstantDataArray *)0x0) {
    std::terminate();
  }
  type = (Type *)(u_local_1->
                 super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::vector
            (&local_48,
             (vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> *)mem);
  ConstantDataArray::ConstantDataArray(local_30,type,&local_48);
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::~vector(&local_48)
  ;
  append_typed_destructor<LLVMBC::ConstantDataArray>(this,local_30);
  return local_30;
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}